

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

size_t fio_local_addr(char *dest,size_t limit)

{
  char *__s;
  addrinfo *paVar1;
  int iVar2;
  size_t sVar3;
  addrinfo **__pai;
  size_t __n;
  addrinfo *info;
  addrinfo *local_60;
  addrinfo local_58;
  
  iVar2 = gethostname(dest,limit);
  if (iVar2 == 0) {
    local_58.ai_addrlen = 0;
    local_58._20_4_ = 0;
    local_58.ai_addr = (sockaddr *)0x0;
    local_58.ai_canonname = (char *)0x0;
    local_58.ai_next = (addrinfo *)0x0;
    local_58.ai_socktype = 1;
    local_58.ai_protocol = 0;
    local_58.ai_flags = 2;
    local_58.ai_family = 0;
    __pai = &local_60;
    iVar2 = getaddrinfo(dest,"http",&local_58,__pai);
    __n = 0;
    if (iVar2 == 0) {
      do {
        paVar1 = *__pai;
        if (paVar1 == (addrinfo *)0x0) goto LAB_00105670;
        __s = paVar1->ai_canonname;
        __pai = &paVar1->ai_next;
      } while (__s == (char *)0x0);
      sVar3 = strlen(__s);
      __n = limit - 1;
      if (sVar3 < limit) {
        __n = sVar3;
      }
      memcpy(dest,__s,__n);
      dest[__n] = '\0';
LAB_00105670:
      freeaddrinfo(local_60);
    }
  }
  else {
    __n = 0;
  }
  return __n;
}

Assistant:

size_t fio_local_addr(char *dest, size_t limit) {
  if (gethostname(dest, limit))
    return 0;

  struct addrinfo hints, *info;
  memset(&hints, 0, sizeof hints);
  hints.ai_family = AF_UNSPEC;     // don't care IPv4 or IPv6
  hints.ai_socktype = SOCK_STREAM; // TCP stream sockets
  hints.ai_flags = AI_CANONNAME;   // get cannonical name

  if (getaddrinfo(dest, "http", &hints, &info) != 0)
    return 0;

  for (struct addrinfo *pos = info; pos; pos = pos->ai_next) {
    if (pos->ai_canonname) {
      size_t len = strlen(pos->ai_canonname);
      if (len >= limit)
        len = limit - 1;
      memcpy(dest, pos->ai_canonname, len);
      dest[len] = 0;
      freeaddrinfo(info);
      return len;
    }
  }

  freeaddrinfo(info);
  return 0;
}